

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

FT_Error ps_dimension_set_mask_bits
                   (PS_Dimension dim,FT_Byte *source,FT_UInt source_pos,FT_UInt source_bits,
                   FT_UInt end_point,FT_Memory memory)

{
  FT_Error local_34;
  FT_Error error;
  FT_Memory memory_local;
  FT_UInt end_point_local;
  FT_UInt source_bits_local;
  FT_UInt source_pos_local;
  FT_Byte *source_local;
  PS_Dimension dim_local;
  
  local_34 = ps_dimension_reset_mask(dim,end_point,memory);
  if (local_34 == 0) {
    local_34 = ps_mask_table_set_bits(&dim->masks,source,source_pos,source_bits,memory);
  }
  return local_34;
}

Assistant:

static FT_Error
  ps_dimension_set_mask_bits( PS_Dimension    dim,
                              const FT_Byte*  source,
                              FT_UInt         source_pos,
                              FT_UInt         source_bits,
                              FT_UInt         end_point,
                              FT_Memory       memory )
  {
    FT_Error  error;


    /* reset current mask, if any */
    error = ps_dimension_reset_mask( dim, end_point, memory );
    if ( error )
      goto Exit;

    /* set bits in new mask */
    error = ps_mask_table_set_bits( &dim->masks, source,
                                    source_pos, source_bits, memory );

  Exit:
    return error;
  }